

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

char16 * Js::FunctionProxy::WrapWithBrackets
                   (char16 *name,charcount_t sz,ScriptContext *scriptContext)

{
  Recycler *pRVar1;
  char16 *next;
  TrackAllocData local_50;
  char16_t *local_28;
  char16 *wrappedName;
  ScriptContext *scriptContext_local;
  char16 *pcStack_10;
  charcount_t sz_local;
  char16 *name_local;
  
  wrappedName = (char16 *)scriptContext;
  scriptContext_local._4_4_ = sz;
  pcStack_10 = name;
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&char16_t::typeinfo,0,(ulong)(scriptContext_local._4_4_ + 3),
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0xab8);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  local_28 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                       ((Memory *)pRVar1,(Recycler *)Memory::Recycler::AllocLeaf,0,
                        (ulong)(scriptContext_local._4_4_ + 3));
  *local_28 = L'[';
  js_wmemcpy_s(local_28 + 1,(ulong)scriptContext_local._4_4_,pcStack_10,
               (ulong)scriptContext_local._4_4_);
  local_28[scriptContext_local._4_4_ + 1] = L']';
  local_28[scriptContext_local._4_4_ + 2] = L'\0';
  return local_28;
}

Assistant:

const char16* FunctionProxy::WrapWithBrackets(const char16* name, charcount_t sz, ScriptContext* scriptContext)
    {
        char16 * wrappedName = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, sz + 3); //[]\0
        wrappedName[0] = _u('[');
        char16 *next = wrappedName;
        js_wmemcpy_s(++next, sz, name, sz);
        wrappedName[sz + 1] = _u(']');
        wrappedName[sz + 2] = _u('\0');
        return wrappedName;

    }